

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O1

ostream * Eigen::internal::print_matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    (ostream *s,Matrix<double,__1,__1,_0,__1,__1> *_m,IOFormat *fmt)

{
  IOFormat *pIVar1;
  ostream oVar2;
  ostream oVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long local_220;
  stringstream sstr;
  ios_base local_1a0 [264];
  long *local_98;
  long local_90;
  long local_88 [2];
  Matrix<double,__1,__1,_0,__1,__1> *local_78;
  long local_70;
  IOFormat *local_68;
  undefined8 local_60;
  ostream *local_58;
  undefined8 local_50;
  long local_48;
  long local_40;
  ostream local_31;
  
  if ((_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols == 0
      || (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows ==
         0) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (s,(fmt->matPrefix)._M_dataplus._M_p,(fmt->matPrefix)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,(fmt->matSuffix)._M_dataplus._M_p,(fmt->matSuffix)._M_string_length);
  }
  else {
    local_70 = (long)fmt->precision;
    if (local_70 == -1) {
      local_70 = 0;
    }
    else if (fmt->precision == -2) {
      local_70 = 0xf;
    }
    if (local_70 == 0) {
      local_50 = 0;
    }
    else {
      local_50 = *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 8);
      *(long *)(s + *(long *)(*(long *)s + -0x18) + 8) = local_70;
    }
    lVar5 = 0;
    local_68 = fmt;
    local_58 = s;
    if (((fmt->flags & 1) == 0) &&
       (0 < (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols)
       ) {
      local_40 = 0;
      local_48 = 0;
      lVar5 = 0;
      do {
        if (0 < (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_rows) {
          lVar6 = 0;
          lVar7 = lVar5;
          do {
            std::__cxx11::stringstream::stringstream((stringstream *)&local_220);
            std::ios::copyfmt((ios *)((stringstream *)&local_220 + *(long *)(local_220 + -0x18)));
            std::ostream::_M_insert<double>
                      (*(double *)
                        ((long)(_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                               ).m_storage.m_data +
                        lVar6 * 8 +
                        (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_rows * local_40));
            std::__cxx11::stringbuf::str();
            lVar5 = local_90;
            if (local_90 < lVar7) {
              lVar5 = lVar7;
            }
            if (local_98 != local_88) {
              operator_delete(local_98,local_88[0] + 1);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)&local_220);
            std::ios_base::~ios_base(local_1a0);
            lVar6 = lVar6 + 1;
            lVar7 = lVar5;
          } while (lVar6 < (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                           m_storage.m_rows);
        }
        local_48 = local_48 + 1;
        local_40 = local_40 + 8;
      } while (local_48 <
               (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_cols);
    }
    s = local_58;
    lVar7 = *(long *)(*(long *)local_58 + -0x18);
    poVar4 = local_58 + lVar7;
    local_60 = *(undefined8 *)(local_58 + lVar7 + 0x10);
    local_48 = lVar5;
    if (local_58[lVar7 + 0xe1] == (ostream)0x0) {
      oVar2 = (ostream)std::ios::widen((char)poVar4);
      poVar4[0xe0] = oVar2;
      poVar4[0xe1] = (ostream)0x1;
    }
    pIVar1 = local_68;
    local_31 = poVar4[0xe0];
    std::__ostream_insert<char,std::char_traits<char>>
              (s,(local_68->matPrefix)._M_dataplus._M_p,(local_68->matPrefix)._M_string_length);
    lVar5 = local_48;
    if (0 < (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows)
    {
      lVar7 = 0;
      local_78 = _m;
      do {
        if (lVar7 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (s,(pIVar1->rowSpacer)._M_dataplus._M_p,(pIVar1->rowSpacer)._M_string_length);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (s,(pIVar1->rowPrefix)._M_dataplus._M_p,(pIVar1->rowPrefix)._M_string_length);
        local_40 = lVar7;
        if (lVar5 != 0) {
          poVar4 = s + *(long *)(*(long *)s + -0x18);
          oVar2 = (ostream)pIVar1->fill;
          if (s[*(long *)(*(long *)s + -0x18) + 0xe1] == (ostream)0x0) {
            oVar3 = (ostream)std::ios::widen((char)poVar4);
            poVar4[0xe0] = oVar3;
            poVar4[0xe1] = (ostream)0x1;
          }
          poVar4[0xe0] = oVar2;
          *(long *)(s + *(long *)(*(long *)s + -0x18) + 0x10) = local_48;
          lVar5 = local_48;
        }
        std::ostream::_M_insert<double>
                  ((_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                   m_data[local_40]);
        if (1 < (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_cols) {
          lVar7 = 1;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      (s,(pIVar1->coeffSeparator)._M_dataplus._M_p,
                       (pIVar1->coeffSeparator)._M_string_length);
            if (lVar5 != 0) {
              poVar4 = s + *(long *)(*(long *)s + -0x18);
              oVar2 = (ostream)pIVar1->fill;
              if (s[*(long *)(*(long *)s + -0x18) + 0xe1] == (ostream)0x0) {
                oVar3 = (ostream)std::ios::widen((char)poVar4);
                poVar4[0xe0] = oVar3;
                poVar4[0xe1] = (ostream)0x1;
              }
              poVar4[0xe0] = oVar2;
              *(long *)(s + *(long *)(*(long *)s + -0x18) + 0x10) = local_48;
              lVar5 = local_48;
              _m = local_78;
            }
            std::ostream::_M_insert<double>
                      ((_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_data
                       [(_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_rows * lVar7 + local_40]);
            lVar7 = lVar7 + 1;
          } while (lVar7 < (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                           m_storage.m_cols);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (s,(pIVar1->rowSuffix)._M_dataplus._M_p,(pIVar1->rowSuffix)._M_string_length);
        lVar7 = local_40;
        if (local_40 <
            (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
            + -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (s,(pIVar1->rowSeparator)._M_dataplus._M_p,
                     (pIVar1->rowSeparator)._M_string_length);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_rows);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (s,(pIVar1->matSuffix)._M_dataplus._M_p,(pIVar1->matSuffix)._M_string_length);
    if (local_70 != 0) {
      *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 8) = local_50;
    }
    if (lVar5 != 0) {
      poVar4 = s + *(long *)(*(long *)s + -0x18);
      if (s[*(long *)(*(long *)s + -0x18) + 0xe1] == (ostream)0x0) {
        oVar2 = (ostream)std::ios::widen((char)poVar4);
        poVar4[0xe0] = oVar2;
        poVar4[0xe1] = (ostream)0x1;
      }
      poVar4[0xe0] = local_31;
      *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 0x10) = local_60;
    }
  }
  return s;
}

Assistant:

std::ostream & print_matrix(std::ostream & s, const Derived& _m, const IOFormat& fmt)
{
  using internal::is_same;
  using internal::conditional;

  if(_m.size() == 0)
  {
    s << fmt.matPrefix << fmt.matSuffix;
    return s;
  }
  
  typename Derived::Nested m = _m;
  typedef typename Derived::Scalar Scalar;
  typedef typename
      conditional<
          is_same<Scalar, char>::value ||
            is_same<Scalar, unsigned char>::value ||
            is_same<Scalar, numext::int8_t>::value ||
            is_same<Scalar, numext::uint8_t>::value,
          int,
          typename conditional<
              is_same<Scalar, std::complex<char> >::value ||
                is_same<Scalar, std::complex<unsigned char> >::value ||
                is_same<Scalar, std::complex<numext::int8_t> >::value ||
                is_same<Scalar, std::complex<numext::uint8_t> >::value,
              std::complex<int>,
              const Scalar&
            >::type
        >::type PrintType;

  Index width = 0;

  std::streamsize explicit_precision;
  if(fmt.precision == StreamPrecision)
  {
    explicit_precision = 0;
  }
  else if(fmt.precision == FullPrecision)
  {
    if (NumTraits<Scalar>::IsInteger)
    {
      explicit_precision = 0;
    }
    else
    {
      explicit_precision = significant_decimals_impl<Scalar>::run();
    }
  }
  else
  {
    explicit_precision = fmt.precision;
  }

  std::streamsize old_precision = 0;
  if(explicit_precision) old_precision = s.precision(explicit_precision);

  bool align_cols = !(fmt.flags & DontAlignCols);
  if(align_cols)
  {
    // compute the largest width
    for(Index j = 0; j < m.cols(); ++j)
      for(Index i = 0; i < m.rows(); ++i)
      {
        std::stringstream sstr;
        sstr.copyfmt(s);
        sstr << static_cast<PrintType>(m.coeff(i,j));
        width = std::max<Index>(width, Index(sstr.str().length()));
      }
  }
  std::streamsize old_width = s.width();
  char old_fill_character = s.fill();
  s << fmt.matPrefix;
  for(Index i = 0; i < m.rows(); ++i)
  {
    if (i)
      s << fmt.rowSpacer;
    s << fmt.rowPrefix;
    if(width) {
      s.fill(fmt.fill);
      s.width(width);
    }
    s << static_cast<PrintType>(m.coeff(i, 0));
    for(Index j = 1; j < m.cols(); ++j)
    {
      s << fmt.coeffSeparator;
      if(width) {
        s.fill(fmt.fill);
        s.width(width);
      }
      s << static_cast<PrintType>(m.coeff(i, j));
    }
    s << fmt.rowSuffix;
    if( i < m.rows() - 1)
      s << fmt.rowSeparator;
  }
  s << fmt.matSuffix;
  if(explicit_precision) s.precision(old_precision);
  if(width) {
    s.fill(old_fill_character);
    s.width(old_width);
  }
  return s;
}